

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

QDomNodePrivate * __thiscall
QDomDocumentTypePrivate::insertAfter
          (QDomDocumentTypePrivate *this,QDomNodePrivate *newChild,QDomNodePrivate *refChild)

{
  int iVar1;
  QDomNodePrivate *pQVar2;
  QDomNamedNodeMapPrivate *pQVar3;
  long in_FS_OFFSET;
  QDomNodePrivate *p;
  iterator local_50;
  QArrayDataPointer<char16_t> local_38;
  QDomNodePrivate *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QDomNodePrivate::insertAfter(&this->super_QDomNodePrivate,newChild,refChild);
  local_20 = pQVar2;
  if (pQVar2 != (QDomNodePrivate *)0x0) {
    iVar1 = (*pQVar2->_vptr_QDomNodePrivate[0xb])(pQVar2);
    if (iVar1 == 6) {
      pQVar3 = this->entities;
    }
    else {
      iVar1 = (*pQVar2->_vptr_QDomNodePrivate[0xb])(pQVar2);
      if (iVar1 != 0xc) goto LAB_001102ec;
      pQVar3 = this->notations;
    }
    local_38.d = (pQVar2->name).d.d;
    local_38.ptr = (pQVar2->name).d.ptr;
    local_38.size = (pQVar2->name).d.size;
    if (local_38.d != (Data *)0x0) {
      LOCK();
      ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_38.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QMultiHash<QString,QDomNodePrivate*>::emplace<QDomNodePrivate*const&>
              (&local_50,&pQVar3->map,(QString *)&local_38,&local_20);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  }
LAB_001102ec:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return local_20;
  }
  __stack_chk_fail();
}

Assistant:

QDomNodePrivate* QDomDocumentTypePrivate::insertAfter(QDomNodePrivate* newChild, QDomNodePrivate* refChild)
{
    // Call the original implementation
    QDomNodePrivate* p = QDomNodePrivate::insertAfter(newChild, refChild);
    // Update the maps
    if (p && p->isEntity())
        entities->map.insert(p->nodeName(), p);
    else if (p && p->isNotation())
        notations->map.insert(p->nodeName(), p);

    return p;
}